

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_6_6_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  float *data;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  uint uVar48;
  ulong uVar49;
  int iVar50;
  ulong uVar51;
  int iVar52;
  long lVar53;
  int c1;
  long lVar54;
  int iVar55;
  float *pfVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  float *pfVar68;
  float *pfVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  int scale;
  long lVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  float *pfVar81;
  ulong uVar82;
  byte bVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  undefined1 auVar122 [12];
  undefined1 auVar121 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  undefined1 auVar126 [64];
  int c2_1;
  int data_width;
  int c2;
  int c2_3;
  int c2_4;
  int c2_2;
  int local_1f8;
  float local_d8;
  
  auVar92._8_4_ = 0x3effffff;
  auVar92._0_8_ = 0x3effffff3effffff;
  auVar92._12_4_ = 0x3effffff;
  auVar121 = ZEXT1664(auVar92);
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  fVar99 = ipoint->scale;
  auVar126 = ZEXT464((uint)fVar99);
  auVar84 = vpternlogd_avx512vl(auVar92,ZEXT416((uint)fVar99),auVar91,0xf8);
  auVar84 = ZEXT416((uint)(fVar99 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  fVar97 = -0.08 / (fVar99 * fVar99);
  scale = (int)auVar84._0_4_;
  auVar85._0_4_ = (int)auVar84._0_4_;
  auVar85._4_4_ = (int)auVar84._4_4_;
  auVar85._8_4_ = (int)auVar84._8_4_;
  auVar85._12_4_ = (int)auVar84._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar85);
  auVar85 = vpternlogd_avx512vl(auVar92,ZEXT416((uint)ipoint->x),auVar91,0xf8);
  auVar85 = ZEXT416((uint)(ipoint->x + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar86._0_8_ = (double)auVar85._0_4_;
  auVar86._8_8_ = auVar85._8_8_;
  auVar90._0_8_ = (double)fVar99;
  auVar90._8_8_ = 0;
  auVar85 = vfmadd231sd_fma(auVar86,auVar90,ZEXT816(0x3fe0000000000000));
  auVar89._0_4_ = (float)auVar85._0_8_;
  auVar89._4_12_ = auVar85._4_12_;
  auVar85 = vpternlogd_avx512vl(auVar92,ZEXT416((uint)ipoint->y),auVar91,0xf8);
  fVar8 = auVar89._0_4_ - auVar84._0_4_;
  auVar85 = ZEXT416((uint)(ipoint->y + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar87._0_8_ = (double)auVar85._0_4_;
  auVar87._8_8_ = auVar85._8_8_;
  auVar85 = vfmadd231sd_fma(auVar87,auVar90,ZEXT816(0x3fe0000000000000));
  auVar88._0_4_ = (float)auVar85._0_8_;
  auVar88._4_12_ = auVar85._4_12_;
  fVar125 = auVar88._0_4_ - auVar84._0_4_;
  auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar99),auVar89);
  auVar85 = vpternlogd_avx512vl(auVar92,auVar84,auVar91,0xf8);
  auVar84 = ZEXT416((uint)(auVar84._0_4_ + auVar85._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = ZEXT416((uint)fVar99);
  if (scale < (int)auVar84._0_4_) {
    auVar93._8_4_ = 0x3effffff;
    auVar93._0_8_ = 0x3effffff3effffff;
    auVar93._12_4_ = 0x3effffff;
    auVar94._8_4_ = 0x80000000;
    auVar94._0_8_ = 0x8000000080000000;
    auVar94._12_4_ = 0x80000000;
    auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar85,auVar88);
    auVar86 = vpternlogd_avx512vl(auVar94,auVar84,auVar93,0xea);
    auVar84 = ZEXT416((uint)(auVar84._0_4_ + auVar86._0_4_));
    auVar84 = vroundss_avx(auVar84,auVar84,0xb);
    if (scale < (int)auVar84._0_4_) {
      auVar84 = vfmadd231ss_fma(auVar89,auVar85,ZEXT416(0x41300000));
      auVar95._8_4_ = 0x80000000;
      auVar95._0_8_ = 0x8000000080000000;
      auVar95._12_4_ = 0x80000000;
      auVar86 = vpternlogd_avx512vl(auVar95,auVar84,auVar93,0xea);
      auVar84 = ZEXT416((uint)(auVar84._0_4_ + auVar86._0_4_));
      auVar84 = vroundss_avx(auVar84,auVar84,0xb);
      if ((int)auVar84._0_4_ + scale <= iimage->width) {
        auVar84 = vfmadd231ss_fma(auVar88,auVar85,ZEXT416(0x41300000));
        auVar19._8_4_ = 0x80000000;
        auVar19._0_8_ = 0x8000000080000000;
        auVar19._12_4_ = 0x80000000;
        auVar86 = vpternlogd_avx512vl(auVar93,auVar84,auVar19,0xf8);
        auVar84 = ZEXT416((uint)(auVar84._0_4_ + auVar86._0_4_));
        auVar84 = vroundss_avx(auVar84,auVar84,0xb);
        if ((int)auVar84._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar68 = iimage->data;
          iVar52 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar125 = fVar125 + 0.5;
          pfVar81 = haarResponseY + 0x7d;
          pfVar56 = haarResponseX + 0x7d;
          uVar48 = 0xfffffff4;
          do {
            auVar84._0_4_ = (float)(int)uVar48;
            auVar122 = in_ZMM8._4_12_;
            auVar84._4_12_ = auVar122;
            auVar84 = vfmadd213ss_fma(auVar84,auVar85,ZEXT416((uint)fVar125));
            iVar30 = (int)auVar84._0_4_;
            auVar110._0_4_ = (float)(int)(uVar48 | 1);
            auVar110._4_12_ = auVar122;
            auVar84 = vfmadd213ss_fma(auVar110,auVar85,ZEXT416((uint)fVar125));
            iVar29 = (int)auVar84._0_4_;
            auVar111._0_4_ = (float)(int)(uVar48 + 2);
            auVar111._4_12_ = auVar122;
            auVar86 = ZEXT416((uint)fVar125);
            auVar84 = vfmadd213ss_fma(auVar111,auVar85,auVar86);
            iVar28 = (int)auVar84._0_4_;
            auVar112._0_4_ = (float)(int)(uVar48 + 3);
            auVar112._4_12_ = auVar122;
            auVar84 = vfmadd213ss_fma(auVar112,auVar85,auVar86);
            iVar27 = (int)auVar84._0_4_;
            auVar113._0_4_ = (float)(int)(uVar48 + 4);
            auVar113._4_12_ = auVar122;
            auVar84 = vfmadd213ss_fma(auVar113,auVar85,auVar86);
            iVar26 = (int)auVar84._0_4_;
            auVar114._0_4_ = (float)(int)(uVar48 + 5);
            auVar114._4_12_ = auVar122;
            auVar84 = vfmadd213ss_fma(auVar114,auVar85,auVar86);
            iVar33 = (iVar30 + -1 + scale) * iVar1;
            iVar42 = (iVar30 + -1 + iVar52) * iVar1;
            iVar32 = (iVar30 + -1) * iVar1;
            iVar40 = (iVar29 + -1) * iVar1;
            iVar34 = (iVar29 + -1 + scale) * iVar1;
            iVar43 = (iVar29 + -1 + iVar52) * iVar1;
            iVar38 = (iVar28 + -1) * iVar1;
            iVar41 = (iVar28 + -1 + iVar52) * iVar1;
            iVar35 = (iVar28 + -1 + scale) * iVar1;
            iVar29 = (iVar27 + -1) * iVar1;
            iVar39 = (iVar27 + -1 + iVar52) * iVar1;
            iVar36 = (iVar27 + -1 + scale) * iVar1;
            iVar27 = (iVar26 + -1) * iVar1;
            iVar30 = (iVar26 + -1 + scale) * iVar1;
            iVar37 = (iVar26 + -1 + iVar52) * iVar1;
            iVar26 = (int)auVar84._0_4_;
            iVar28 = (iVar26 + -1) * iVar1;
            iVar31 = (iVar26 + -1 + scale) * iVar1;
            iVar26 = (iVar26 + -1 + iVar52) * iVar1;
            lVar74 = 0;
            do {
              iVar44 = (int)lVar74;
              auVar115._0_4_ = (float)(iVar44 + -0xc);
              auVar122 = auVar121._4_12_;
              auVar115._4_12_ = auVar122;
              auVar84 = vfmadd213ss_fma(auVar115,auVar85,ZEXT416((uint)fVar8));
              iVar50 = (int)auVar84._0_4_;
              auVar116._0_4_ = (float)(iVar44 + -0xb);
              auVar116._4_12_ = auVar122;
              auVar84 = vfmadd213ss_fma(auVar116,auVar85,ZEXT416((uint)fVar8));
              iVar72 = iVar50 + -1 + scale;
              iVar67 = iVar50 + -1 + iVar52;
              iVar79 = (int)auVar84._0_4_;
              auVar117._0_4_ = (float)(iVar44 + -10);
              auVar117._4_12_ = auVar122;
              auVar86 = ZEXT416((uint)fVar8);
              auVar84 = vfmadd213ss_fma(auVar117,auVar85,auVar86);
              iVar66 = (int)auVar84._0_4_;
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(float)(iVar44 + -9)),auVar85,auVar86);
              iVar45 = (int)auVar84._0_4_;
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(float)(iVar44 + -8)),auVar85,auVar86);
              iVar46 = (int)auVar84._0_4_;
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(float)(iVar44 + -7)),auVar85,auVar86);
              fVar99 = pfVar68[iVar42 + -1 + iVar50];
              fVar98 = pfVar68[iVar32 + iVar67];
              iVar61 = iVar79 + -1 + scale;
              iVar62 = iVar79 + -1 + iVar52;
              auVar88 = SUB6416(ZEXT464(0x40000000),0);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar72] -
                                                      pfVar68[iVar42 + iVar72])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar67] -
                                                      pfVar68[iVar32 + -1 + iVar50])));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar50] -
                                                      pfVar68[iVar33 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar67] -
                                                      pfVar68[iVar32 + -1 + iVar50])));
              pfVar56[lVar74 + -0x7d] = (fVar99 - fVar98) + auVar86._0_4_;
              pfVar81[lVar74 + -0x7d] = auVar87._0_4_ - (fVar99 - fVar98);
              iVar78 = iVar66 + -1 + iVar52;
              fVar99 = pfVar68[iVar42 + -1 + iVar79];
              fVar98 = pfVar68[iVar32 + iVar62];
              iVar63 = iVar66 + -1 + scale;
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar79] -
                                                      pfVar68[iVar33 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar62] -
                                                      pfVar68[iVar32 + -1 + iVar79])));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar61] -
                                                      pfVar68[iVar42 + iVar61])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar62] -
                                                      pfVar68[iVar32 + -1 + iVar79])));
              pfVar56[lVar74 + -0x7c] = (fVar99 - fVar98) + auVar87._0_4_;
              pfVar81[lVar74 + -0x7c] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar42 + -1 + iVar66];
              fVar98 = pfVar68[iVar32 + iVar78];
              iVar55 = iVar45 + -1 + scale;
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar66] -
                                                      pfVar68[iVar33 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar78] -
                                                      pfVar68[iVar32 + -1 + iVar66])));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar63] -
                                                      pfVar68[iVar42 + iVar63])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar78] -
                                                      pfVar68[iVar32 + -1 + iVar66])));
              pfVar56[lVar74 + -0x7b] = (fVar99 - fVar98) + auVar87._0_4_;
              pfVar81[lVar74 + -0x7b] = auVar86._0_4_ - (fVar99 - fVar98);
              iVar58 = iVar45 + -1 + iVar52;
              fVar99 = pfVar68[iVar42 + -1 + iVar45];
              fVar98 = pfVar68[iVar32 + iVar58];
              iVar59 = iVar46 + -1 + scale;
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar55] -
                                                      pfVar68[iVar42 + iVar55])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar58] -
                                                      pfVar68[iVar32 + -1 + iVar45])));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar45] -
                                                      pfVar68[iVar33 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar58] -
                                                      pfVar68[iVar32 + -1 + iVar45])));
              pfVar56[lVar74 + -0x7a] = (fVar99 - fVar98) + auVar86._0_4_;
              pfVar81[lVar74 + -0x7a] = auVar87._0_4_ - (fVar99 - fVar98);
              iVar60 = iVar46 + -1 + iVar52;
              fVar99 = pfVar68[iVar42 + -1 + iVar46];
              iVar80 = (int)auVar84._0_4_;
              fVar105 = pfVar68[iVar42 + iVar60] - pfVar68[iVar32 + -1 + iVar46];
              auVar121 = ZEXT464((uint)fVar105);
              fVar98 = pfVar68[iVar32 + iVar60];
              iVar57 = iVar80 + -1 + scale;
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar59] -
                                                      pfVar68[iVar42 + iVar59])),auVar88,
                                        ZEXT416((uint)fVar105));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar46] -
                                                      pfVar68[iVar33 + iVar60])),auVar88,
                                        ZEXT416((uint)fVar105));
              pfVar56[lVar74 + -0x79] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x79] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar42 + -1 + iVar80];
              iVar47 = iVar80 + -1 + iVar52;
              fVar98 = pfVar68[iVar32 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar32 + iVar57] -
                                                      pfVar68[iVar42 + iVar57])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar47] -
                                                      pfVar68[iVar32 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar33 + -1 + iVar80] -
                                                      pfVar68[iVar33 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar42 + iVar47] -
                                                      pfVar68[iVar32 + -1 + iVar80])));
              pfVar56[lVar74 + -0x78] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x78] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar50];
              fVar98 = pfVar68[iVar40 + iVar67];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar72] -
                                                      pfVar68[iVar43 + iVar72])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar67] -
                                                      pfVar68[iVar40 + -1 + iVar50])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar50] -
                                                      pfVar68[iVar34 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar67] -
                                                      pfVar68[iVar40 + -1 + iVar50])));
              pfVar56[lVar74 + -0x65] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x65] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar79];
              fVar98 = pfVar68[iVar40 + iVar62];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar61] -
                                                      pfVar68[iVar43 + iVar61])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar62] -
                                                      pfVar68[iVar40 + -1 + iVar79])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar79] -
                                                      pfVar68[iVar34 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar62] -
                                                      pfVar68[iVar40 + -1 + iVar79])));
              pfVar56[lVar74 + -100] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -100] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar66];
              fVar98 = pfVar68[iVar40 + iVar78];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar63] -
                                                      pfVar68[iVar43 + iVar63])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar78] -
                                                      pfVar68[iVar40 + -1 + iVar66])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar66] -
                                                      pfVar68[iVar34 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar78] -
                                                      pfVar68[iVar40 + -1 + iVar66])));
              pfVar56[lVar74 + -99] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -99] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar45];
              fVar98 = pfVar68[iVar40 + iVar58];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar55] -
                                                      pfVar68[iVar43 + iVar55])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar58] -
                                                      pfVar68[iVar40 + -1 + iVar45])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar45] -
                                                      pfVar68[iVar34 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar58] -
                                                      pfVar68[iVar40 + -1 + iVar45])));
              pfVar56[lVar74 + -0x62] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x62] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar46];
              fVar98 = pfVar68[iVar40 + iVar60];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar59] -
                                                      pfVar68[iVar43 + iVar59])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar60] -
                                                      pfVar68[iVar40 + -1 + iVar46])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar46] -
                                                      pfVar68[iVar34 + iVar60])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar60] -
                                                      pfVar68[iVar40 + -1 + iVar46])));
              pfVar56[lVar74 + -0x61] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x61] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar43 + -1 + iVar80];
              fVar98 = pfVar68[iVar40 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar40 + iVar57] -
                                                      pfVar68[iVar43 + iVar57])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar47] -
                                                      pfVar68[iVar40 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar34 + -1 + iVar80] -
                                                      pfVar68[iVar34 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar43 + iVar47] -
                                                      pfVar68[iVar40 + -1 + iVar80])));
              pfVar56[lVar74 + -0x60] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x60] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar50];
              fVar98 = pfVar68[iVar38 + iVar67];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar72] -
                                                      pfVar68[iVar41 + iVar72])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar67] -
                                                      pfVar68[iVar38 + -1 + iVar50])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar50] -
                                                      pfVar68[iVar35 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar67] -
                                                      pfVar68[iVar38 + -1 + iVar50])));
              pfVar56[lVar74 + -0x4d] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x4d] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar79];
              fVar98 = pfVar68[iVar38 + iVar62];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar61] -
                                                      pfVar68[iVar41 + iVar61])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar62] -
                                                      pfVar68[iVar38 + -1 + iVar79])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar79] -
                                                      pfVar68[iVar35 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar62] -
                                                      pfVar68[iVar38 + -1 + iVar79])));
              pfVar56[lVar74 + -0x4c] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x4c] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar66];
              fVar98 = pfVar68[iVar38 + iVar78];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar63] -
                                                      pfVar68[iVar41 + iVar63])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar78] -
                                                      pfVar68[iVar38 + -1 + iVar66])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar66] -
                                                      pfVar68[iVar35 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar78] -
                                                      pfVar68[iVar38 + -1 + iVar66])));
              pfVar56[lVar74 + -0x4b] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x4b] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar45];
              fVar98 = pfVar68[iVar38 + iVar58];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar55] -
                                                      pfVar68[iVar41 + iVar55])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar58] -
                                                      pfVar68[iVar38 + -1 + iVar45])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar45] -
                                                      pfVar68[iVar35 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar58] -
                                                      pfVar68[iVar38 + -1 + iVar45])));
              pfVar56[lVar74 + -0x4a] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x4a] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar46];
              fVar98 = pfVar68[iVar38 + iVar60];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar59] -
                                                      pfVar68[iVar41 + iVar59])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar60] -
                                                      pfVar68[iVar38 + -1 + iVar46])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar46] -
                                                      pfVar68[iVar35 + iVar60])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar60] -
                                                      pfVar68[iVar38 + -1 + iVar46])));
              pfVar56[lVar74 + -0x49] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x49] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar41 + -1 + iVar80];
              fVar98 = pfVar68[iVar38 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar38 + iVar57] -
                                                      pfVar68[iVar41 + iVar57])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar47] -
                                                      pfVar68[iVar38 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar35 + -1 + iVar80] -
                                                      pfVar68[iVar35 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar41 + iVar47] -
                                                      pfVar68[iVar38 + -1 + iVar80])));
              pfVar56[lVar74 + -0x48] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x48] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar50];
              fVar98 = pfVar68[iVar29 + iVar67];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar72] -
                                                      pfVar68[iVar39 + iVar72])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar67] -
                                                      pfVar68[iVar29 + -1 + iVar50])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar50] -
                                                      pfVar68[iVar36 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar67] -
                                                      pfVar68[iVar29 + -1 + iVar50])));
              pfVar56[lVar74 + -0x35] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x35] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar79];
              fVar98 = pfVar68[iVar29 + iVar62];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar61] -
                                                      pfVar68[iVar39 + iVar61])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar62] -
                                                      pfVar68[iVar29 + -1 + iVar79])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar79] -
                                                      pfVar68[iVar36 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar62] -
                                                      pfVar68[iVar29 + -1 + iVar79])));
              pfVar56[lVar74 + -0x34] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x34] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar66];
              fVar98 = pfVar68[iVar29 + iVar78];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar63] -
                                                      pfVar68[iVar39 + iVar63])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar78] -
                                                      pfVar68[iVar29 + -1 + iVar66])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar66] -
                                                      pfVar68[iVar36 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar78] -
                                                      pfVar68[iVar29 + -1 + iVar66])));
              pfVar56[lVar74 + -0x33] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x33] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar45];
              fVar98 = pfVar68[iVar29 + iVar58];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar55] -
                                                      pfVar68[iVar39 + iVar55])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar58] -
                                                      pfVar68[iVar29 + -1 + iVar45])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar45] -
                                                      pfVar68[iVar36 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar58] -
                                                      pfVar68[iVar29 + -1 + iVar45])));
              pfVar56[lVar74 + -0x32] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x32] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar46];
              fVar98 = pfVar68[iVar29 + iVar60];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar59] -
                                                      pfVar68[iVar39 + iVar59])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar60] -
                                                      pfVar68[iVar29 + -1 + iVar46])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar46] -
                                                      pfVar68[iVar36 + iVar60])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar60] -
                                                      pfVar68[iVar29 + -1 + iVar46])));
              pfVar56[lVar74 + -0x31] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x31] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar39 + -1 + iVar80];
              fVar98 = pfVar68[iVar29 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar29 + iVar57] -
                                                      pfVar68[iVar39 + iVar57])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar47] -
                                                      pfVar68[iVar29 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar36 + -1 + iVar80] -
                                                      pfVar68[iVar36 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar39 + iVar47] -
                                                      pfVar68[iVar29 + -1 + iVar80])));
              pfVar56[lVar74 + -0x30] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x30] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar50];
              fVar98 = pfVar68[iVar27 + iVar67];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar72] -
                                                      pfVar68[iVar37 + iVar72])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar67] -
                                                      pfVar68[iVar27 + -1 + iVar50])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar50] -
                                                      pfVar68[iVar30 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar67] -
                                                      pfVar68[iVar27 + -1 + iVar50])));
              pfVar56[lVar74 + -0x1d] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x1d] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar79];
              fVar98 = pfVar68[iVar27 + iVar62];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar61] -
                                                      pfVar68[iVar37 + iVar61])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar62] -
                                                      pfVar68[iVar27 + -1 + iVar79])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar79] -
                                                      pfVar68[iVar30 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar62] -
                                                      pfVar68[iVar27 + -1 + iVar79])));
              pfVar56[lVar74 + -0x1c] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x1c] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar66];
              fVar98 = pfVar68[iVar27 + iVar78];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar63] -
                                                      pfVar68[iVar37 + iVar63])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar78] -
                                                      pfVar68[iVar27 + -1 + iVar66])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar66] -
                                                      pfVar68[iVar30 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar78] -
                                                      pfVar68[iVar27 + -1 + iVar66])));
              pfVar56[lVar74 + -0x1b] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x1b] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar45];
              fVar98 = pfVar68[iVar27 + iVar58];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar55] -
                                                      pfVar68[iVar37 + iVar55])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar58] -
                                                      pfVar68[iVar27 + -1 + iVar45])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar45] -
                                                      pfVar68[iVar30 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar58] -
                                                      pfVar68[iVar27 + -1 + iVar45])));
              pfVar56[lVar74 + -0x1a] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x1a] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar46];
              fVar98 = pfVar68[iVar27 + iVar60];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar59] -
                                                      pfVar68[iVar37 + iVar59])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar60] -
                                                      pfVar68[iVar27 + -1 + iVar46])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar46] -
                                                      pfVar68[iVar30 + iVar60])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar60] -
                                                      pfVar68[iVar27 + -1 + iVar46])));
              pfVar56[lVar74 + -0x19] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x19] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar37 + -1 + iVar80];
              fVar98 = pfVar68[iVar27 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar27 + iVar57] -
                                                      pfVar68[iVar37 + iVar57])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar47] -
                                                      pfVar68[iVar27 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar30 + -1 + iVar80] -
                                                      pfVar68[iVar30 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar37 + iVar47] -
                                                      pfVar68[iVar27 + -1 + iVar80])));
              pfVar56[lVar74 + -0x18] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -0x18] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar50];
              fVar98 = pfVar68[iVar28 + iVar67];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar72] -
                                                      pfVar68[iVar72 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar67 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar50])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar50] -
                                                      pfVar68[iVar31 + iVar67])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar67 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar50])));
              pfVar56[lVar74 + -5] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -5] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar79];
              fVar98 = pfVar68[iVar28 + iVar62];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar61] -
                                                      pfVar68[iVar61 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar62 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar79])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar79] -
                                                      pfVar68[iVar31 + iVar62])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar62 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar79])));
              pfVar56[lVar74 + -4] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -4] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar66];
              fVar98 = pfVar68[iVar28 + iVar78];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar66] -
                                                      pfVar68[iVar31 + iVar78])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar78 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar66])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar63] -
                                                      pfVar68[iVar63 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar78 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar66])));
              pfVar56[lVar74 + -3] = (fVar99 - fVar98) + auVar86._0_4_;
              pfVar81[lVar74 + -3] = auVar84._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar45];
              fVar98 = pfVar68[iVar28 + iVar58];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar55] -
                                                      pfVar68[iVar55 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar58 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar45])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar45] -
                                                      pfVar68[iVar31 + iVar58])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar58 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar45])));
              pfVar56[lVar74 + -2] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74 + -2] = auVar86._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar46];
              fVar98 = pfVar68[iVar28 + iVar60];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar46] -
                                                      pfVar68[iVar31 + iVar60])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar60 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar46])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar59] -
                                                      pfVar68[iVar59 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar60 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar46])));
              pfVar56[lVar74 + -1] = (fVar99 - fVar98) + auVar86._0_4_;
              pfVar81[lVar74 + -1] = auVar84._0_4_ - (fVar99 - fVar98);
              fVar99 = pfVar68[iVar26 + -1 + iVar80];
              fVar98 = pfVar68[iVar28 + iVar47];
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar28 + iVar57] -
                                                      pfVar68[iVar57 + iVar26])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar47 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar80])));
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar31 + -1 + iVar80] -
                                                      pfVar68[iVar31 + iVar47])),auVar88,
                                        ZEXT416((uint)(pfVar68[iVar47 + iVar26] -
                                                      pfVar68[iVar28 + -1 + iVar80])));
              pfVar56[lVar74] = (fVar99 - fVar98) + auVar84._0_4_;
              pfVar81[lVar74] = auVar86._0_4_ - (fVar99 - fVar98);
              lVar74 = lVar74 + 6;
            } while (iVar44 + -0xc < 6);
            pfVar56 = pfVar56 + 0x90;
            pfVar81 = pfVar81 + 0x90;
            bVar3 = (int)uVar48 < 6;
            uVar48 = uVar48 + 6;
          } while (bVar3);
          goto LAB_00273e7d;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar74 = 0;
  uVar48 = 0xfffffff4;
  do {
    auVar84 = vpbroadcastd_avx512vl();
    auVar84 = vpaddd_avx(auVar84,_DAT_00599790);
    auVar103._0_4_ = (float)(int)uVar48;
    auVar103._4_12_ = in_ZMM8._4_12_;
    auVar107._0_4_ = (float)(int)(uVar48 | 1);
    auVar107._4_12_ = in_ZMM8._4_12_;
    auVar86 = vfmadd213ss_fma(auVar103,auVar126._0_16_,ZEXT416((uint)fVar125));
    auVar87 = vfmadd213ss_fma(auVar107,auVar126._0_16_,ZEXT416((uint)fVar125));
    fVar98 = auVar86._0_4_;
    fVar105 = auVar87._0_4_;
    iVar55 = (int)((double)((ulong)(0.0 <= fVar98) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar98) * -0x4020000000000000) + (double)fVar98);
    auVar84 = vcvtdq2ps_avx(auVar84);
    iVar26 = iVar1 + iVar55;
    iVar50 = (int)((double)((ulong)(0.0 <= fVar105) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar105) * -0x4020000000000000) + (double)fVar105);
    auVar25._4_4_ = fVar125;
    auVar25._0_4_ = fVar125;
    auVar25._8_4_ = fVar125;
    auVar25._12_4_ = fVar125;
    auVar22._4_4_ = fVar99;
    auVar22._0_4_ = fVar99;
    auVar22._8_4_ = fVar99;
    auVar22._12_4_ = fVar99;
    auVar84 = vfmadd132ps_fma(auVar84,auVar25,auVar22);
    iVar37 = iVar50 + -1;
    uVar49 = vcmpps_avx512vl(auVar84,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar84);
    auVar102._8_8_ = 0xbfe0000000000000;
    auVar102._0_8_ = 0xbfe0000000000000;
    auVar102._16_8_ = 0xbfe0000000000000;
    auVar102._24_8_ = 0xbfe0000000000000;
    auVar96._12_4_ = 0x3fe00000;
    auVar96._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar96._16_8_ = 0x3fe0000000000000;
    auVar96._24_8_ = 0x3fe0000000000000;
    auVar96 = vblendmpd_avx512vl(auVar102,auVar96);
    bVar3 = (bool)((byte)uVar49 & 1);
    bVar4 = (bool)((byte)(uVar49 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar49 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar49 >> 3) & 1);
    iVar27 = iVar55 + -1;
    iVar28 = iVar55 + -1 + scale;
    iVar29 = iVar1 + -1 + iVar55;
    iVar30 = iVar1 + iVar50;
    iVar31 = iVar50 + -1 + scale;
    iVar32 = iVar1 + -1 + iVar50;
    auVar100._0_4_ =
         (int)((double)((ulong)bVar3 * auVar96._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar100._4_4_ =
         (int)((double)((ulong)bVar4 * auVar96._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar100._8_4_ =
         (int)((double)((ulong)bVar5 * auVar96._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar100._12_4_ =
         (int)((double)((ulong)bVar6 * auVar96._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar20._8_4_ = 1;
    auVar20._0_8_ = 0x100000001;
    auVar20._12_4_ = 1;
    uVar49 = vpcmpd_avx512vl(auVar100,auVar20,1);
    uVar82 = uVar49 & 0xf;
    iVar38 = iVar1 + auVar100._12_4_;
    iVar39 = auVar100._12_4_ + -1 + scale;
    uVar73 = uVar82 >> 1;
    uVar51 = uVar82 >> 2;
    uVar82 = uVar82 >> 3;
    iVar40 = iVar1 + -1 + auVar100._12_4_;
    iVar33 = auVar100._12_4_ + -1;
    iVar41 = iVar1 + auVar100._8_4_;
    iVar42 = auVar100._8_4_ + -1 + scale;
    iVar43 = auVar100._8_4_ + -1;
    iVar34 = iVar1 + -1 + auVar100._8_4_;
    iVar44 = iVar1 + auVar100._4_4_;
    iVar45 = auVar100._4_4_ + -1;
    iVar46 = auVar100._4_4_ + -1 + scale;
    iVar35 = iVar1 + -1 + auVar100._4_4_;
    iVar66 = auVar100._0_4_ + -1 + scale;
    iVar47 = iVar1 + auVar100._0_4_;
    iVar57 = iVar1 + -1 + auVar100._0_4_;
    iVar36 = auVar100._0_4_ + -1;
    pfVar68 = haarResponseX;
    pfVar81 = haarResponseY;
    lVar65 = lVar74;
    iVar52 = -0xc;
    do {
      auVar101._0_4_ = (float)iVar52;
      auVar101._4_12_ = auVar121._4_12_;
      auVar84 = vfmadd213ss_fma(auVar101,auVar126._0_16_,ZEXT416((uint)fVar8));
      auVar119._0_4_ = (float)(iVar52 + 1);
      auVar119._4_12_ = auVar121._4_12_;
      auVar86 = vfmadd213ss_fma(auVar119,auVar126._0_16_,ZEXT416((uint)fVar8));
      fVar98 = auVar84._0_4_;
      fVar105 = auVar86._0_4_;
      iVar72 = (int)((double)((ulong)(0.0 <= fVar98) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar98) * -0x4020000000000000) + (double)fVar98);
      if (((iVar55 < 1) || (iVar72 < 1)) || (iimage->height < iVar26)) {
LAB_00271109:
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar72,scale,(float *)((long)pfVar68 + lVar65),
               (float *)((long)pfVar81 + lVar65));
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar67 = iimage->width;
        iVar58 = iVar1 + iVar72;
        if (iVar67 < iVar58) goto LAB_00271109;
        iVar61 = iVar72 + -1 + scale;
        iVar59 = iimage->data_width;
        pfVar56 = iimage->data;
        iVar60 = iVar59 * iVar27;
        iVar62 = iVar59 * iVar29;
        fVar98 = pfVar56[iVar62 + -1 + iVar72];
        fVar9 = pfVar56[iVar60 + -1 + iVar58];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar56[iVar60 + iVar61] - pfVar56[iVar62 + iVar61]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar56[iVar62 + -1 + iVar58] -
                                                pfVar56[iVar60 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar56[iVar59 * iVar28 + -1 + iVar72] -
                                                pfVar56[iVar59 * iVar28 + -1 + iVar58])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar56[iVar62 + -1 + iVar58] -
                                                pfVar56[iVar60 + -1 + iVar72])));
        *(float *)((long)pfVar68 + lVar65) = (fVar98 - fVar9) + auVar84._0_4_;
        *(float *)((long)pfVar81 + lVar65) = auVar86._0_4_ - (fVar98 - fVar9);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 4);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 4);
      iVar58 = (int)((double)((ulong)(0.0 <= fVar105) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar105) * -0x4020000000000000) + (double)fVar105);
      if (((iVar55 < 1) || (iVar58 < 1)) ||
         ((iimage->height < iVar26 || (iVar59 = iVar1 + iVar58, iVar67 < iVar59)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar62 = iVar58 + -1 + scale;
        iVar61 = iVar60 * iVar27;
        iVar63 = iVar60 * iVar29;
        fVar98 = pfVar2[iVar63 + -1 + iVar58];
        fVar105 = pfVar2[iVar61 + -1 + iVar59];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar61 + iVar62] - pfVar2[iVar63 + iVar62]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar59] -
                                                pfVar2[iVar61 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar28 + -1 + iVar58] -
                                                pfVar2[iVar60 * iVar28 + -1 + iVar59])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar59] -
                                                pfVar2[iVar61 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      auVar84 = vpbroadcastd_avx512vl();
      auVar84 = vpaddd_avx(auVar84,_DAT_00599790);
      auVar84 = vcvtdq2ps_avx(auVar84);
      auVar24._4_4_ = fVar8;
      auVar24._0_4_ = fVar8;
      auVar24._8_4_ = fVar8;
      auVar24._12_4_ = fVar8;
      auVar23._4_4_ = fVar99;
      auVar23._0_4_ = fVar99;
      auVar23._8_4_ = fVar99;
      auVar23._12_4_ = fVar99;
      auVar86 = vfmadd132ps_fma(auVar84,auVar24,auVar23);
      auVar84 = vshufps_avx(auVar86,auVar86,0xff);
      uVar18 = vcmpps_avx512vl(auVar86,_DAT_00599190,0xd);
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 8);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 8);
      bVar83 = (byte)(uVar18 >> 3);
      iVar59 = (int)((double)((ulong)(bVar83 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar83 & 1) * -0x4020000000000000) +
                    (double)auVar84._0_4_);
      if (((iVar55 < 1) || (iVar59 < 1)) ||
         ((iimage->height < iVar26 || (iVar60 = iVar1 + iVar59, iVar67 < iVar60)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar61 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar80 = iVar59 + -1 + scale;
        iVar63 = iVar61 * iVar27;
        iVar62 = iVar61 * iVar29;
        fVar98 = pfVar2[iVar62 + -1 + iVar59];
        fVar105 = pfVar2[iVar63 + -1 + iVar60];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar80] - pfVar2[iVar62 + iVar80]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar62 + -1 + iVar60] -
                                                pfVar2[iVar63 + -1 + iVar59])));
        auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar61 * iVar28 + -1 + iVar59] -
                                                pfVar2[iVar61 * iVar28 + -1 + iVar60])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar62 + -1 + iVar60] -
                                                pfVar2[iVar63 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar87._0_4_ - (fVar98 - fVar105);
      }
      auVar84 = vpermilpd_avx(auVar86,1);
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xc);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0xc);
      bVar83 = (byte)uVar18;
      iVar60 = (int)((double)((ulong)(bVar83 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar83 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar84._0_4_);
      if ((((iVar55 < 1) || (iVar60 < 1)) || (iimage->height < iVar26)) ||
         (iVar61 = iVar1 + iVar60, iVar67 < iVar61)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar62 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar79 = iVar60 + -1 + scale;
        iVar80 = iVar62 * iVar27;
        iVar63 = iVar62 * iVar29;
        fVar98 = pfVar2[iVar63 + -1 + iVar60];
        fVar105 = pfVar2[iVar80 + -1 + iVar61];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 + iVar79] - pfVar2[iVar63 + iVar79]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar61] -
                                                pfVar2[iVar80 + -1 + iVar60])));
        auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar62 * iVar28 + -1 + iVar60] -
                                                pfVar2[iVar62 * iVar28 + -1 + iVar61])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar61] -
                                                pfVar2[iVar80 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar87._0_4_ - (fVar98 - fVar105);
      }
      auVar84 = vmovshdup_avx(auVar86);
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x10);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x10);
      iVar61 = (int)((double)((ulong)(bVar83 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar83 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar84._0_4_);
      if (((iVar55 < 1) || (iVar61 < 1)) ||
         ((iimage->height < iVar26 || (iVar62 = iVar1 + iVar61, iVar67 < iVar62)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar63 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar61 + -1 + scale;
        iVar79 = iVar63 * iVar27;
        iVar80 = iVar63 * iVar29;
        fVar98 = pfVar2[iVar80 + -1 + iVar61];
        fVar105 = pfVar2[iVar79 + -1 + iVar62];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar80 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar80 + -1 + iVar62] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 * iVar28 + -1 + iVar61] -
                                                pfVar2[iVar63 * iVar28 + -1 + iVar62])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar80 + -1 + iVar62] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar87._0_4_ - (fVar98 - fVar105);
      }
      local_d8 = auVar86._0_4_;
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x14);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x14);
      iVar62 = (int)((double)((ulong)(bVar83 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar83 & 1) * -0x4020000000000000) + (double)local_d8);
      if (((iVar55 < 1) || (iVar62 < 1)) ||
         ((iimage->height < iVar26 || (iVar63 = iVar1 + iVar62, iVar67 < iVar63)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar55,iVar62,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar62 + -1 + scale;
        iVar79 = iVar80 * iVar27;
        iVar77 = iVar80 * iVar29;
        fVar98 = pfVar2[iVar77 + -1 + iVar62];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar28 + -1 + iVar62] -
                                                pfVar2[iVar80 * iVar28 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x60);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x60);
      if ((((iVar50 < 1) || (iVar72 < 1)) || (iimage->height < iVar30)) ||
         (iVar63 = iVar1 + iVar72, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar72,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar72 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar72];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar72] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 100);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 100);
      if (((iVar50 < 1) || (iVar58 < 1)) ||
         ((iimage->height < iVar30 || (iVar63 = iVar1 + iVar58, iVar67 < iVar63)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar58 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar58];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar58] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x68);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x68);
      if (((iVar50 < 1) || (iVar59 < 1)) ||
         ((iimage->height < iVar30 || (iVar63 = iVar1 + iVar59, iVar67 < iVar63)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar59 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar59];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar59] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x6c);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x6c);
      if ((((iVar50 < 1) || (iVar60 < 1)) || (iimage->height < iVar30)) ||
         (iVar63 = iVar1 + iVar60, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar60 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar60];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar60] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x70);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x70);
      if (((iVar50 < 1) || (iVar61 < 1)) ||
         ((iimage->height < iVar30 || (iVar63 = iVar1 + iVar61, iVar67 < iVar63)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar61 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar61];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar61] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x74);
      pfVar69 = (float *)((long)pfVar81 + lVar65 + 0x74);
      if (((iVar50 < 1) || (iVar62 < 1)) ||
         ((iimage->height < iVar30 || (iVar63 = iVar1 + iVar62, iVar67 < iVar63)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar50,iVar62,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar62 + -1 + scale;
        iVar79 = iVar80 * iVar37;
        iVar77 = iVar80 * iVar32;
        fVar98 = pfVar2[iVar77 + -1 + iVar62];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar31 + -1 + iVar62] -
                                                pfVar2[iVar80 * iVar31 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xc0);
      pfVar69 = (float *)(lVar65 + 0xc0 + (long)pfVar81);
      if (((iVar72 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar72, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar72,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar72 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar72];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar72] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xc4);
      pfVar69 = (float *)(lVar65 + 0xc4 + (long)pfVar81);
      if (((iVar58 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar58, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar58 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar58];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar58] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 200);
      pfVar69 = (float *)(lVar65 + 200 + (long)pfVar81);
      if (((iVar59 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar59, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar59 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar59];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar59] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xcc);
      pfVar69 = (float *)(lVar65 + 0xcc + (long)pfVar81);
      if (((iVar60 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar60, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar60 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar60];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar60] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xd0);
      pfVar69 = (float *)(lVar65 + 0xd0 + (long)pfVar81);
      if (((iVar61 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar61, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar61 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar61];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar61] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0xd4);
      pfVar69 = (float *)(lVar65 + 0xd4 + (long)pfVar81);
      if (((iVar62 < 1 || uVar82 != 0) || (iimage->height < iVar38)) ||
         (iVar63 = iVar1 + iVar62, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._12_4_,iVar62,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar62 + -1 + scale;
        iVar79 = iVar80 * iVar33;
        iVar77 = iVar80 * iVar40;
        fVar98 = pfVar2[iVar77 + -1 + iVar62];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar80 * iVar39 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x120);
      pfVar69 = (float *)(lVar65 + 0x120 + (long)pfVar81);
      if (((iVar72 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar72, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar72,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar72 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar72];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar72] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x124);
      pfVar69 = (float *)(lVar65 + 0x124 + (long)pfVar81);
      if (((iVar58 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar58, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar58 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar58];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar58] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x128);
      pfVar69 = (float *)(lVar65 + 0x128 + (long)pfVar81);
      if (((iVar59 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar59, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar59 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar59];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar59] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 300);
      pfVar69 = (float *)(lVar65 + 300 + (long)pfVar81);
      if (((iVar60 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar60, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar60 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar60];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar60] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x130);
      pfVar69 = (float *)(lVar65 + 0x130 + (long)pfVar81);
      if (((iVar61 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar61, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar61 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar61];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar61] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x134);
      pfVar69 = (float *)(lVar65 + 0x134 + (long)pfVar81);
      if (((iVar62 < 1 || (uVar51 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar63 = iVar1 + iVar62, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._8_4_,iVar62,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar62 + -1 + scale;
        iVar79 = iVar80 * iVar43;
        iVar77 = iVar80 * iVar34;
        fVar98 = pfVar2[iVar77 + -1 + iVar62];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar42 + -1 + iVar62] -
                                                pfVar2[iVar80 * iVar42 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x180);
      pfVar69 = (float *)(lVar65 + 0x180 + (long)pfVar81);
      if (((iVar72 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar72, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar72,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar72 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar72];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar72] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar72])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x184);
      pfVar69 = (float *)(lVar65 + 0x184 + (long)pfVar81);
      if (((iVar58 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar58, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar58 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar58];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar58] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x188);
      pfVar69 = (float *)(lVar65 + 0x188 + (long)pfVar81);
      if (((iVar59 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar59, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar59 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar59];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar59] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x18c);
      pfVar69 = (float *)(lVar65 + 0x18c + (long)pfVar81);
      if (((iVar60 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar60, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar60 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar60];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar60] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 400);
      pfVar69 = (float *)(lVar65 + 400 + (long)pfVar81);
      if (((iVar61 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar61, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar61 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar61];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar61] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x194);
      pfVar69 = (float *)(lVar65 + 0x194 + (long)pfVar81);
      if (((iVar62 < 1 || (uVar73 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar63 = iVar1 + iVar62, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._4_4_,iVar62,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar78 = iVar62 + -1 + scale;
        iVar79 = iVar80 * iVar45;
        iVar77 = iVar80 * iVar35;
        fVar98 = pfVar2[iVar77 + -1 + iVar62];
        fVar105 = pfVar2[iVar79 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar78] - pfVar2[iVar77 + iVar78]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar46 + -1 + iVar62] -
                                                pfVar2[iVar80 * iVar46 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar77 + -1 + iVar63] -
                                                pfVar2[iVar79 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x1e0);
      pfVar69 = (float *)(lVar65 + 0x1e0 + (long)pfVar81);
      if (((iVar72 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar63 = iVar1 + iVar72, iVar67 < iVar63)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar72,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar80 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar79 = iVar72 + -1 + scale;
        iVar77 = iVar80 * iVar36;
        iVar78 = iVar80 * iVar57;
        fVar98 = pfVar2[iVar78 + -1 + iVar72];
        fVar105 = pfVar2[iVar77 + -1 + iVar63];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar77 + iVar79] - pfVar2[iVar78 + iVar79]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar78 + -1 + iVar63] -
                                                pfVar2[iVar77 + -1 + iVar72])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 * iVar66 + -1 + iVar72] -
                                                pfVar2[iVar80 * iVar66 + -1 + iVar63])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar78 + -1 + iVar63] -
                                                pfVar2[iVar77 + -1 + iVar72])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x1e4);
      pfVar69 = (float *)(lVar65 + 0x1e4 + (long)pfVar81);
      if (((iVar58 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar72 = iVar1 + iVar58, iVar67 < iVar72)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar58,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar63 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar80 = iVar58 + -1 + scale;
        iVar78 = iVar63 * iVar36;
        iVar79 = iVar63 * iVar57;
        fVar98 = pfVar2[iVar79 + -1 + iVar58];
        fVar105 = pfVar2[iVar78 + -1 + iVar72];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar78 + iVar80] - pfVar2[iVar79 + iVar80]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar79 + -1 + iVar72] -
                                                pfVar2[iVar78 + -1 + iVar58])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 * iVar66 + -1 + iVar58] -
                                                pfVar2[iVar63 * iVar66 + -1 + iVar72])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar79 + -1 + iVar72] -
                                                pfVar2[iVar78 + -1 + iVar58])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x1e8);
      pfVar69 = (float *)(lVar65 + 0x1e8 + (long)pfVar81);
      if (((iVar59 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar72 = iVar1 + iVar59, iVar67 < iVar72)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar59,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar58 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar63 = iVar59 + -1 + scale;
        iVar79 = iVar58 * iVar36;
        iVar80 = iVar58 * iVar57;
        fVar98 = pfVar2[iVar80 + -1 + iVar59];
        fVar105 = pfVar2[iVar79 + -1 + iVar72];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar79 + iVar63] - pfVar2[iVar80 + iVar63]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar80 + -1 + iVar72] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar58 * iVar66 + -1 + iVar59] -
                                                pfVar2[iVar58 * iVar66 + -1 + iVar72])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar80 + -1 + iVar72] -
                                                pfVar2[iVar79 + -1 + iVar59])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x1ec);
      pfVar69 = (float *)(lVar65 + 0x1ec + (long)pfVar81);
      if (((iVar60 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar72 = iVar1 + iVar60, iVar67 < iVar72)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar60,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar58 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar60 + -1 + scale;
        iVar80 = iVar58 * iVar36;
        iVar63 = iVar58 * iVar57;
        fVar98 = pfVar2[iVar63 + -1 + iVar60];
        fVar105 = pfVar2[iVar80 + -1 + iVar72];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar80 + iVar59] - pfVar2[iVar63 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar72] -
                                                pfVar2[iVar80 + -1 + iVar60])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar58 * iVar66 + -1 + iVar60] -
                                                pfVar2[iVar58 * iVar66 + -1 + iVar72])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar72] -
                                                pfVar2[iVar80 + -1 + iVar60])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 0x1f0);
      pfVar69 = (float *)(lVar65 + 0x1f0 + (long)pfVar81);
      if (((iVar61 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar72 = iVar1 + iVar61, iVar67 < iVar72)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar61,scale,pfVar56,pfVar69);
        iVar67 = iimage->width;
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar58 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar61 + -1 + scale;
        iVar63 = iVar58 * iVar36;
        iVar60 = iVar58 * iVar57;
        fVar98 = pfVar2[iVar60 + -1 + iVar61];
        fVar105 = pfVar2[iVar63 + -1 + iVar72];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar59] - pfVar2[iVar60 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar60 + -1 + iVar72] -
                                                pfVar2[iVar63 + -1 + iVar61])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar58 * iVar66 + -1 + iVar61] -
                                                pfVar2[iVar58 * iVar66 + -1 + iVar72])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar60 + -1 + iVar72] -
                                                pfVar2[iVar63 + -1 + iVar61])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      pfVar56 = (float *)((long)pfVar68 + lVar65 + 500);
      pfVar69 = (float *)(lVar65 + 500 + (long)pfVar81);
      if (((iVar62 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar72 = iVar1 + iVar62, iVar67 < iVar72)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar100._0_4_,iVar62,scale,pfVar56,pfVar69);
        pfVar68 = haarResponseX;
        pfVar81 = haarResponseY;
      }
      else {
        iVar67 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar58 = iVar62 + -1 + scale;
        iVar60 = iVar67 * iVar36;
        iVar59 = iVar67 * iVar57;
        fVar98 = pfVar2[iVar59 + -1 + iVar62];
        fVar105 = pfVar2[iVar60 + -1 + iVar72];
        auVar84 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar58] - pfVar2[iVar59 + iVar58]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar72] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar86 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar67 * iVar66 + -1 + iVar62] -
                                                pfVar2[iVar67 * iVar66 + -1 + iVar72])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar72] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar56 = (fVar98 - fVar105) + auVar84._0_4_;
        *pfVar69 = auVar86._0_4_ - (fVar98 - fVar105);
      }
      auVar126 = ZEXT1664(auVar85);
      lVar65 = lVar65 + 0x18;
      bVar3 = iVar52 < 6;
      iVar52 = iVar52 + 6;
    } while (bVar3);
    lVar74 = lVar74 + 0x240;
    bVar3 = (int)uVar48 < 6;
    uVar48 = uVar48 + 6;
  } while (bVar3);
LAB_00273e7d:
  fVar125 = auVar126._0_4_;
  auVar124._8_4_ = 0x3effffff;
  auVar124._0_8_ = 0x3effffff3effffff;
  auVar124._12_4_ = 0x3effffff;
  auVar123._8_4_ = 0x80000000;
  auVar123._0_8_ = 0x8000000080000000;
  auVar123._12_4_ = 0x80000000;
  auVar84 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 0.5)),auVar123,0xf8);
  auVar84 = ZEXT416((uint)(fVar125 * 0.5 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 1.5)),auVar123,0xf8);
  auVar85 = ZEXT416((uint)(fVar125 * 1.5 + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar86 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 2.5)),auVar123,0xf8);
  auVar86 = ZEXT416((uint)(fVar125 * 2.5 + auVar86._0_4_));
  auVar86 = vroundss_avx(auVar86,auVar86,0xb);
  auVar87 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 3.5)),auVar123,0xf8);
  auVar87 = ZEXT416((uint)(fVar125 * 3.5 + auVar87._0_4_));
  auVar87 = vroundss_avx(auVar87,auVar87,0xb);
  auVar88 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 4.5)),auVar123,0xf8);
  auVar88 = ZEXT416((uint)(fVar125 * 4.5 + auVar88._0_4_));
  auVar88 = vroundss_avx(auVar88,auVar88,0xb);
  auVar89 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 5.5)),auVar123,0xf8);
  auVar89 = ZEXT416((uint)(fVar125 * 5.5 + auVar89._0_4_));
  auVar89 = vroundss_avx(auVar89,auVar89,0xb);
  auVar90 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 6.5)),auVar123,0xf8);
  auVar90 = ZEXT416((uint)(fVar125 * 6.5 + auVar90._0_4_));
  auVar90 = vroundss_avx(auVar90,auVar90,0xb);
  auVar91 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 7.5)),auVar123,0xf8);
  auVar91 = ZEXT416((uint)(auVar91._0_4_ + fVar125 * 7.5));
  auVar91 = vroundss_avx(auVar91,auVar91,0xb);
  auVar92 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 8.5)),auVar123,0xf8);
  auVar92 = ZEXT416((uint)(fVar125 * 8.5 + auVar92._0_4_));
  auVar92 = vroundss_avx(auVar92,auVar92,0xb);
  auVar93 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 9.5)),auVar123,0xf8);
  auVar93 = ZEXT416((uint)(fVar125 * 9.5 + auVar93._0_4_));
  auVar93 = vroundss_avx(auVar93,auVar93,0xb);
  auVar94 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 10.5)),auVar123,0xf8);
  auVar94 = ZEXT416((uint)(fVar125 * 10.5 + auVar94._0_4_));
  auVar94 = vroundss_avx(auVar94,auVar94,0xb);
  auVar95 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar125 * 11.5)),auVar123,0xf8);
  fVar106 = auVar86._0_4_;
  fVar99 = fVar106 + auVar85._0_4_;
  fVar8 = fVar106 + auVar84._0_4_;
  auVar86 = ZEXT416((uint)(fVar125 * 11.5 + auVar95._0_4_));
  auVar86 = vroundss_avx(auVar86,auVar86,0xb);
  fVar125 = fVar106 - auVar84._0_4_;
  fVar98 = fVar106 - auVar85._0_4_;
  fVar105 = fVar106 - auVar87._0_4_;
  fVar9 = fVar106 - auVar88._0_4_;
  fVar10 = fVar106 - auVar89._0_4_;
  fVar106 = fVar106 - auVar90._0_4_;
  fVar120 = auVar91._0_4_;
  fVar11 = fVar120 - auVar87._0_4_;
  fVar12 = fVar120 - auVar88._0_4_;
  fVar13 = fVar120 - auVar89._0_4_;
  fVar14 = fVar120 - auVar90._0_4_;
  fVar15 = fVar120 - auVar92._0_4_;
  fVar16 = fVar120 - auVar93._0_4_;
  fVar17 = fVar120 - auVar94._0_4_;
  fVar120 = fVar120 - auVar86._0_4_;
  gauss_s1_c0[0] = expf(fVar99 * fVar99 * fVar97);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar97);
  gauss_s1_c0[2] = expf(fVar125 * fVar125 * fVar97);
  gauss_s1_c0[3] = expf(fVar98 * fVar98 * fVar97);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar105 * fVar105 * fVar97);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar97);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar97);
  gauss_s1_c0[8] = expf(fVar106 * fVar106 * fVar97);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar97);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar97);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar97);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar97);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar97);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar97);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar97);
  gauss_s1_c1[8] = expf(fVar120 * fVar120 * fVar97);
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  uVar49 = 0xfffffff8;
  fVar99 = 0.0;
  lVar74 = 0;
  lVar65 = 0;
  local_1f8 = 0;
  do {
    pfVar68 = gauss_s1_c1;
    uVar48 = (uint)uVar49;
    if (uVar48 != 7) {
      pfVar68 = gauss_s1_c0;
    }
    lVar75 = (long)local_1f8;
    lVar65 = (long)(int)lVar65;
    if (uVar48 == 0xfffffff8) {
      pfVar68 = gauss_s1_c1;
    }
    uVar73 = 0;
    local_1f8 = local_1f8 + 4;
    uVar64 = 0xfffffff8;
    lVar70 = (long)haarResponseX + lVar74;
    lVar53 = (long)haarResponseY + lVar74;
    do {
      pfVar81 = gauss_s1_c1;
      if (uVar64 != 7) {
        pfVar81 = gauss_s1_c0;
      }
      auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar64 == 0xfffffff8) {
        pfVar81 = gauss_s1_c1;
      }
      uVar82 = (ulong)(uVar64 >> 0x1c & 0xfffffff8);
      uVar51 = uVar73;
      lVar54 = lVar53;
      lVar76 = lVar70;
      do {
        lVar71 = 0;
        pfVar56 = (float *)((long)pfVar68 + (ulong)(uint)((int)(uVar49 >> 0x1f) << 5));
        do {
          fVar8 = pfVar81[uVar82] * *pfVar56;
          pfVar56 = pfVar56 + (ulong)(~uVar48 >> 0x1f) * 2 + -1;
          auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar54 + lVar71 * 4)),
                                  ZEXT416(*(uint *)(lVar76 + lVar71 * 4)),0x10);
          lVar71 = lVar71 + 1;
          auVar118._0_4_ = fVar8 * auVar84._0_4_;
          auVar118._4_4_ = fVar8 * auVar84._4_4_;
          auVar118._8_4_ = fVar8 * auVar84._8_4_;
          auVar118._12_4_ = fVar8 * auVar84._12_4_;
          auVar84 = vandps_avx(auVar118,auVar104);
          auVar84 = vmovlhps_avx(auVar118,auVar84);
          auVar108._0_4_ = auVar121._0_4_ + auVar84._0_4_;
          auVar108._4_4_ = auVar121._4_4_ + auVar84._4_4_;
          auVar108._8_4_ = auVar121._8_4_ + auVar84._8_4_;
          auVar108._12_4_ = auVar121._12_4_ + auVar84._12_4_;
          auVar121 = ZEXT1664(auVar108);
        } while (lVar71 != 9);
        uVar51 = uVar51 + 0x18;
        uVar82 = uVar82 + (ulong)(-1 < (int)uVar64) * 2 + -1;
        lVar76 = lVar76 + 0x60;
        lVar54 = lVar54 + 0x60;
      } while (uVar51 < uVar64 * 0x18 + 0x198);
      uVar64 = uVar64 + 5;
      uVar73 = uVar73 + 0x78;
      fVar8 = gauss_s2_arr[lVar75];
      auVar21._4_4_ = fVar8;
      auVar21._0_4_ = fVar8;
      auVar21._8_4_ = fVar8;
      auVar21._12_4_ = fVar8;
      auVar87 = vmulps_avx512vl(auVar108,auVar21);
      lVar75 = lVar75 + 1;
      auVar109._0_4_ = auVar87._0_4_ * auVar87._0_4_;
      auVar109._4_4_ = auVar87._4_4_ * auVar87._4_4_;
      auVar109._8_4_ = auVar87._8_4_ * auVar87._8_4_;
      auVar109._12_4_ = auVar87._12_4_ * auVar87._12_4_;
      auVar85 = vshufpd_avx(auVar87,auVar87,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar65) = auVar87;
      lVar65 = lVar65 + 4;
      lVar70 = lVar70 + 0x1e0;
      lVar53 = lVar53 + 0x1e0;
      auVar84 = vmovshdup_avx(auVar109);
      auVar86 = vfmadd231ss_fma(auVar84,auVar87,auVar87);
      auVar84 = vshufps_avx(auVar87,auVar87,0xff);
      auVar85 = vfmadd213ss_fma(auVar85,auVar85,auVar86);
      auVar84 = vfmadd213ss_fma(auVar84,auVar84,auVar85);
      fVar99 = fVar99 + auVar84._0_4_;
    } while (local_1f8 != (int)lVar75);
    lVar74 = lVar74 + 0x14;
    uVar49 = (ulong)(uVar48 + 5);
  } while ((int)uVar48 < 3);
  if (fVar99 < 0.0) {
    fVar99 = sqrtf(fVar99);
  }
  else {
    auVar84 = vsqrtss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99));
    fVar99 = auVar84._0_4_;
  }
  lVar74 = 0;
  auVar121 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar99)));
  do {
    auVar126 = vmulps_avx512f(auVar121,*(undefined1 (*) [64])(ipoint->descriptor + lVar74));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar74) = auVar126;
    lVar74 = lVar74 + 0x10;
  } while (lVar74 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}